

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

void ft_var_to_normalized(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Fixed *normalized)

{
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  long lVar3;
  GX_AVarTable pGVar4;
  GX_AVarCorrespondence pGVar5;
  FT_UInt *pFVar6;
  FT_ItemVarDelta FVar7;
  FT_Long FVar8;
  FT_Pointer P;
  long lVar9;
  FT_UInt outerIndex;
  ulong uVar10;
  ulong uVar11;
  FT_Fixed *pFVar12;
  GX_AVarSegment pGVar13;
  ulong uVar14;
  long lVar15;
  GX_AVarTable table;
  FT_UInt innerIndex;
  FT_Error error;
  FT_Error local_44;
  FT_Memory local_40;
  FT_Fixed *local_38;
  
  local_44 = 0;
  local_40 = (face->root).memory;
  pGVar1 = face->blend;
  pFVar2 = pGVar1->mmvar;
  uVar10 = (ulong)num_coords;
  if (pFVar2->num_axis < num_coords) {
    uVar10 = (ulong)pFVar2->num_axis;
  }
  if ((int)uVar10 == 0) {
    uVar14 = 0;
  }
  else {
    pFVar12 = &pFVar2->axis->maximum;
    uVar14 = 0;
    do {
      lVar15 = coords[uVar14];
      lVar3 = pFVar12[-1];
      if (lVar15 - lVar3 == 0 || lVar15 < lVar3) {
        if (lVar15 < lVar3) {
          FVar8 = -0x10000;
          if (pFVar12[-2] < lVar15) {
            lVar9 = lVar3 - pFVar12[-2];
            goto LAB_0025b4e8;
          }
        }
        else {
          FVar8 = 0;
        }
      }
      else {
        FVar8 = 0x10000;
        if (lVar15 < *pFVar12) {
          lVar9 = *pFVar12 - lVar3;
LAB_0025b4e8:
          FVar8 = FT_DivFix(lVar15 - lVar3,lVar9);
        }
      }
      normalized[uVar14] = FVar8;
      uVar14 = uVar14 + 1;
      pFVar12 = pFVar12 + 6;
    } while (uVar10 != uVar14);
  }
  if ((uint)uVar14 < pFVar2->num_axis) {
    memset(normalized + (uVar14 & 0xffffffff),0,(ulong)(pFVar2->num_axis + ~(uint)uVar14) * 8 + 8);
  }
  pGVar4 = pGVar1->avar_table;
  if (pGVar4 != (GX_AVarTable)0x0) {
    pGVar13 = pGVar4->avar_segment;
    if ((pGVar13 != (GX_AVarSegment)0x0) && (pFVar2->num_axis != 0)) {
      uVar10 = 0;
      do {
        if (1 < pGVar13->pairCount) {
          pGVar5 = pGVar13->correspondence;
          lVar15 = 0;
          do {
            lVar3 = *(long *)((long)&pGVar5[1].fromCoord + lVar15);
            if (normalized[uVar10] < lVar3) {
              lVar9 = *(long *)((long)&pGVar5->fromCoord + lVar15);
              FVar8 = FT_MulDiv(normalized[uVar10] - lVar9,
                                *(long *)((long)&pGVar5[1].toCoord + lVar15) -
                                *(long *)((long)&pGVar5->toCoord + lVar15),lVar3 - lVar9);
              normalized[uVar10] =
                   FVar8 + *(long *)((long)&pGVar13->correspondence->toCoord + lVar15);
              break;
            }
            lVar15 = lVar15 + 0x10;
          } while ((ulong)pGVar13->pairCount * 0x10 + -0x10 != lVar15);
        }
        uVar10 = uVar10 + 1;
        pGVar13 = pGVar13 + 1;
      } while (uVar10 < pFVar2->num_axis);
    }
    if (((pGVar4->itemStore).varData != (GX_ItemVarData)0x0) &&
       (P = ft_mem_qrealloc(local_40,8,0,(ulong)pFVar2->num_axis,(void *)0x0,&local_44),
       local_44 == 0)) {
      pFVar12 = face->blend->normalizedcoords;
      face->blend->normalizedcoords = normalized;
      uVar10 = (ulong)pFVar2->num_axis;
      if (pFVar2->num_axis != 0) {
        uVar14 = 0;
        local_38 = pFVar12;
        do {
          pFVar6 = (pGVar4->axisMap).innerIndex;
          if (pFVar6 == (FT_UInt *)0x0) {
            outerIndex = 0;
            innerIndex = (FT_UInt)uVar14;
          }
          else {
            uVar10 = (pGVar4->axisMap).mapCount;
            uVar11 = (ulong)((int)uVar10 - 1);
            if (uVar14 < uVar10) {
              uVar11 = uVar14;
            }
            outerIndex = (pGVar4->axisMap).outerIndex[uVar11 & 0xffffffff];
            innerIndex = pFVar6[uVar11 & 0xffffffff];
          }
          lVar15 = normalized[uVar14];
          FVar7 = tt_var_get_item_delta(face,&pGVar4->itemStore,outerIndex,innerIndex);
          lVar15 = (FVar7 << 2) + lVar15;
          if (0xffff < lVar15) {
            lVar15 = 0x10000;
          }
          if (lVar15 < -0xffff) {
            lVar15 = -0x10000;
          }
          *(long *)((long)P + uVar14 * 8) = lVar15;
          uVar14 = uVar14 + 1;
          uVar10 = (ulong)pFVar2->num_axis;
          pFVar12 = local_38;
        } while (uVar14 < uVar10);
      }
      if ((int)uVar10 != 0) {
        uVar14 = 0;
        do {
          normalized[uVar14] = *(FT_Fixed *)((long)P + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
      }
      face->blend->normalizedcoords = pFVar12;
      ft_mem_free(local_40,P);
    }
  }
  return;
}

Assistant:

static void
  ft_var_to_normalized( TT_Face    face,
                        FT_UInt    num_coords,
                        FT_Fixed*  coords,
                        FT_Fixed*  normalized )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = face->root.memory;
    FT_UInt    i, j;

    GX_Blend        blend;
    FT_MM_Var*      mmvar;
    FT_Var_Axis*    a;
    GX_AVarSegment  av;

    FT_Fixed*  new_normalized = NULL;
    FT_Fixed*  old_normalized;


    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_to_normalized:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    /* Axis normalization is a two-stage process.  First we normalize */
    /* based on the [min,def,max] values for the axis to be [-1,0,1]. */
    /* Then, if there's an `avar' table, we renormalize this range.   */

    a = mmvar->axis;
    for ( i = 0; i < num_coords; i++, a++ )
    {
      FT_Fixed  coord = coords[i];


      FT_TRACE5(( "    %d: %.5f\n", i, (double)coord / 65536 ));
      if ( coord > a->maximum || coord < a->minimum )
      {
        FT_TRACE1(( "ft_var_to_normalized: design coordinate %.5f\n",
                    (double)coord / 65536 ));
        FT_TRACE1(( "                      is out of range [%.5f;%.5f];"
                    " clamping\n",
                    (double)a->minimum / 65536,
                    (double)a->maximum / 65536 ));
      }

      if ( coord > a->def )
        normalized[i] = coord >= a->maximum ?  0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->maximum, a->def ) );
      else if ( coord < a->def )
        normalized[i] = coord <= a->minimum ? -0x10000L :
                        FT_DivFix( SUB_LONG( coord, a->def ),
                                   SUB_LONG( a->def, a->minimum ) );
      else
        normalized[i] = 0;
    }

    FT_TRACE5(( "\n" ));

    for ( ; i < mmvar->num_axis; i++ )
      normalized[i] = 0;

    if ( blend->avar_table )
    {
      GX_AVarTable  table = blend->avar_table;


      FT_TRACE5(( "normalized design coordinates"
                  " before applying `avar' data:\n" ));

      if ( table->avar_segment )
      {
        av = table->avar_segment;

        for ( i = 0; i < mmvar->num_axis; i++, av++ )
        {
          for ( j = 1; j < (FT_UInt)av->pairCount; j++ )
          {
            if ( normalized[i] < av->correspondence[j].fromCoord )
            {
              FT_TRACE5(( "  %.5f\n", (double)normalized[i] / 65536 ));

              normalized[i] =
                FT_MulDiv( normalized[i] - av->correspondence[j - 1].fromCoord,
                           av->correspondence[j].toCoord -
                             av->correspondence[j - 1].toCoord,
                           av->correspondence[j].fromCoord -
                             av->correspondence[j - 1].fromCoord ) +
                av->correspondence[j - 1].toCoord;
              break;
            }
          }
        }
      }

      if ( table->itemStore.varData )
      {
        if ( FT_QNEW_ARRAY( new_normalized, mmvar->num_axis ) )
          return;

        /* Install our half-normalized coordinates for the next */
        /* Item Variation Store to work with.                   */
        old_normalized                = face->blend->normalizedcoords;
        face->blend->normalizedcoords = normalized;

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          FT_Fixed  v          = normalized[i];
          FT_UInt   innerIndex = i;
          FT_UInt   outerIndex = 0;
          FT_Int    delta;


          if ( table->axisMap.innerIndex )
          {
            FT_UInt  idx = i;


            if ( idx >= table->axisMap.mapCount )
              idx = table->axisMap.mapCount - 1;

            outerIndex = table->axisMap.outerIndex[idx];
            innerIndex = table->axisMap.innerIndex[idx];
          }

          delta = tt_var_get_item_delta( face,
                                         &table->itemStore,
                                         outerIndex,
                                         innerIndex );

	  v += delta << 2;

	  /* Clamp value range. */
	  v = v >=  0x10000L ?  0x10000 : v;
	  v = v <= -0x10000L ? -0x10000 : v;

          new_normalized[i] = v;
        }

        for ( i = 0; i < mmvar->num_axis; i++ )
        {
          normalized[i] = new_normalized[i];
        }

        face->blend->normalizedcoords = old_normalized;

        FT_FREE( new_normalized );
      }
    }
  }